

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
mjs::parser::parser(parser *this,shared_ptr<mjs::source_file> *source,parse_mode mode)

{
  version vVar1;
  element_type *peVar2;
  wstring_view local_40 [2];
  parse_mode local_1c;
  shared_ptr<mjs::source_file> *psStack_18;
  parse_mode mode_local;
  shared_ptr<mjs::source_file> *source_local;
  parser *this_local;
  
  local_1c = mode;
  psStack_18 = source;
  source_local = &this->source_;
  std::shared_ptr<mjs::source_file>::shared_ptr(&this->source_,source);
  peVar2 = std::__shared_ptr_access<mjs::source_file,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mjs::source_file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  vVar1 = source_file::language_version(peVar2);
  this->version_ = vVar1;
  peVar2 = std::__shared_ptr_access<mjs::source_file,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mjs::source_file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  local_40[0] = source_file::text(peVar2);
  lexer::lexer(&this->lexer_,local_40,this->version_);
  this->strict_mode_ = local_1c != non_strict;
  this->skip_strict_checks_for_first_function_ = local_1c == function_constructor_in_strict_context;
  this->token_start_ = 0;
  this->expression_pos_ = (position_stack_node *)0x0;
  this->statement_pos_ = (position_stack_node *)0x0;
  this->line_break_skipped_ = false;
  this->supress_in_ = false;
  token::token(&this->current_token_,eof);
  check_token(this);
  return;
}

Assistant:

explicit parser(const std::shared_ptr<source_file>& source, parse_mode mode)
        : source_(source)
        , version_(source_->language_version())
        , lexer_(source_->text(), version_)
        , strict_mode_(mode != parse_mode::non_strict)
        , skip_strict_checks_for_first_function_(mode == parse_mode::function_constructor_in_strict_context) {
        check_token();
    }